

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

int __thiscall QThread::exec(QThread *this)

{
  long lVar1;
  QThreadPrivate *status_00;
  QEventLoop *in_RDI;
  long in_FS_OFFSET;
  int returnCode;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> in_stack_0000001c;
  QBindingStatus *status;
  QThreadPrivate *d;
  QEventLoop eventLoop;
  QMutexLocker<QMutex> locker;
  undefined4 in_stack_ffffffffffffff88;
  ProcessEventsFlag in_stack_ffffffffffffff8c;
  QMutexLocker<QMutex> *in_stack_ffffffffffffff90;
  int local_30;
  QEventLoop *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  status_00 = d_func((QThread *)0x556e25);
  QtPrivate::getBindingStatus();
  this_00 = (QEventLoop *)&DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker
            (in_stack_ffffffffffffff90,
             (QMutex *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QtPrivate::BindingStatusOrList::setStatusAndClearList
            ((BindingStatusOrList *)in_RDI,(QBindingStatus *)status_00);
  status_00->data->quitNow = false;
  if ((status_00->exited & 1U) == 0) {
    QMutexLocker<QMutex>::unlock(in_stack_ffffffffffffff90);
    QEventLoop::QEventLoop(in_RDI,(QObject *)status_00);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c);
    local_30 = QEventLoop::exec(this_00,(ProcessEventsFlags)in_stack_0000001c.i);
    QMutexLocker<QMutex>::relock(in_stack_ffffffffffffff90);
    status_00->exited = false;
    status_00->returnCode = -1;
    QEventLoop::~QEventLoop((QEventLoop *)0x556f4b);
  }
  else {
    status_00->exited = false;
    local_30 = status_00->returnCode;
  }
  QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

int QThread::exec()
{
    Q_D(QThread);
    const auto status = QtPrivate::getBindingStatus(QtPrivate::QBindingStatusAccessToken{});

    QMutexLocker locker(&d->mutex);
    d->m_statusOrPendingObjects.setStatusAndClearList(status);
    d->data->quitNow = false;
    if (d->exited) {
        d->exited = false;
        return d->returnCode;
    }
    locker.unlock();

    QEventLoop eventLoop;
    int returnCode = eventLoop.exec();

    locker.relock();
    d->exited = false;
    d->returnCode = -1;
    return returnCode;
}